

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

int Mpm_ManDeriveCuts(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  Mpm_Cut_t *pMVar1;
  Mpm_Cut_t *pCut2;
  uint ReqTime;
  int iVar2;
  int iVar3;
  uint uVar4;
  Mpm_Cut_t *pMVar5;
  Mig_Obj_t *pMVar6;
  int i;
  ulong uVar7;
  Mpm_Uni_t *pMVar8;
  long lVar9;
  long lVar10;
  word uSign;
  ulong uVar11;
  long lVar12;
  Mpm_Cut_t *pCut;
  
  ReqTime = Vec_IntEntry(&p->vRequireds,(uint)pObj->pFans[3] >> 1);
  iVar2 = Mpm_ObjCutBest(p,pObj);
  if ((p->vFreeUnits).nSize != p->nNumCuts + 1) {
    __assert_fail("Vec_PtrSize( &p->vFreeUnits ) == p->nNumCuts + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x24e,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
  }
  iVar3 = Mpm_ObjCutList(p,pObj);
  if (iVar3 != 0) {
    __assert_fail("Mpm_ObjCutList(p, pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x24f,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
  }
  p->nCutStore = 0;
  if (0 < iVar2) {
    pMVar5 = Mpm_ObjCutBestP(p,pObj);
    uVar4 = Mpm_CutGetArrTime(p,pMVar5);
    if (pMVar5->hNext != 0) {
      __assert_fail("pCut->hNext == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x255,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    if ((int)ReqTime < (int)uVar4) {
      printf("Arrival time (%d) exceeds required time (%d) at object %d.\n",(ulong)uVar4,
             (ulong)ReqTime);
    }
    if (p->fMainRun == 0) {
      Mpm_ObjSetTime(p,pObj,uVar4);
    }
    else {
      pMVar5 = Mpm_ManMergeCuts(p,pMVar5,(Mpm_Cut_t *)0x0,(Mpm_Cut_t *)0x0);
      Mpm_ObjAddCutToStore(p,pMVar5,uVar4);
    }
  }
  if (p->pMig->nChoices != 0) {
    iVar3 = Mig_ObjSiblId(pObj);
    if (iVar3 != 0) {
      pMVar6 = Mig_ObjSibl(pObj);
      Mpm_ObjAddChoiceCutsToStore(p,pObj,pMVar6,ReqTime);
    }
  }
  for (lVar12 = 0; (lVar12 != 3 && ((uint)pObj->pFans[lVar12] < 0xfffffffe)); lVar12 = lVar12 + 1) {
    pMVar6 = Mig_ObjFanin(pObj,(int)lVar12);
    if (pMVar6 == (Mig_Obj_t *)0x0) break;
    iVar3 = Mpm_ObjCutList(p,pMVar6);
    lVar9 = 0;
    while (iVar3 != 0) {
      pMVar5 = Mpm_CutFetch(p,iVar3);
      if (pMVar5 == (Mpm_Cut_t *)0x0) break;
      p->pCuts[lVar12][lVar9] = pMVar5;
      uVar11 = 0;
      for (uVar7 = 0; uVar7 < *(uint *)&pMVar5->field_0x4 >> 0x1b; uVar7 = uVar7 + 1) {
        uVar4 = Abc_Lit2Var(pMVar5->pLeaves[uVar7]);
        uVar11 = uVar11 | 1L << ((ulong)uVar4 & 0x3f);
      }
      p->pSigns[lVar12][lVar9] = uVar11;
      lVar9 = lVar9 + 1;
      iVar3 = pMVar5->hNext;
    }
    p->nCuts[lVar12] = (int)lVar9;
  }
  if (0xfffffffd < (uint)pObj->pFans[1]) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x278,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
  }
  if ((uint)pObj->pFans[2] < 0xfffffffe) {
    for (lVar12 = 0;
        (lVar12 < p->nCuts[0] && (pMVar5 = p->pCuts[0][lVar12], pMVar5 != (Mpm_Cut_t *)0x0));
        lVar12 = lVar12 + 1) {
      for (lVar9 = 0;
          (lVar9 < p->nCuts[1] && (pMVar1 = p->pCuts[1][lVar9], pMVar1 != (Mpm_Cut_t *)0x0));
          lVar9 = lVar9 + 1) {
        for (lVar10 = 0;
            (lVar10 < p->nCuts[2] && (pCut2 = p->pCuts[2][lVar10], pCut2 != (Mpm_Cut_t *)0x0));
            lVar10 = lVar10 + 1) {
          iVar3 = Abc_TtCountOnes(p->pSigns[1][lVar9] | p->pSigns[0][lVar12] | p->pSigns[2][lVar10])
          ;
          if (iVar3 <= p->nLutSize) {
            Mpm_ManExploreNewCut(p,pObj,pMVar5,pMVar1,pCut2,ReqTime);
          }
        }
      }
    }
  }
  else {
    for (lVar12 = 0;
        (lVar12 < p->nCuts[0] && (pMVar5 = p->pCuts[0][lVar12], pMVar5 != (Mpm_Cut_t *)0x0));
        lVar12 = lVar12 + 1) {
      for (lVar9 = 0;
          (lVar9 < p->nCuts[1] && (pMVar1 = p->pCuts[1][lVar9], pMVar1 != (Mpm_Cut_t *)0x0));
          lVar9 = lVar9 + 1) {
        iVar3 = Abc_TtCountOnes(p->pSigns[1][lVar9] | p->pSigns[0][lVar12]);
        if (iVar3 <= p->nLutSize) {
          Mpm_ManExploreNewCut(p,pObj,pMVar5,pMVar1,(Mpm_Cut_t *)0x0,ReqTime);
        }
      }
    }
  }
  if (p->nCutStore < 1) {
    __assert_fail("p->nCutStore > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x27f,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
  }
  pMVar8 = p->pCutStore[0];
  if ((int)ReqTime < pMVar8->mTime) {
    if (p->fMainRun != 0) {
      __assert_fail("!p->fMainRun",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x28b,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
  }
  else {
    if (iVar2 != 0) {
      Mmr_StepRecycle(p->pManCuts,iVar2);
      pMVar8 = p->pCutStore[0];
    }
    iVar2 = Mpm_CutCreate(p,&pMVar8->pCut,&pCut);
    Mpm_ObjSetCutBest(p,pObj,iVar2);
    Mpm_ObjSetTime(p,pObj,p->pCutStore[0]->mTime);
    Vec_IntWriteEntry(&p->vAreas,(uint)pObj->pFans[3] >> 1,p->pCutStore[0]->mArea);
    Vec_IntWriteEntry(&p->vEdges,(uint)pObj->pFans[3] >> 1,p->pCutStore[0]->mEdge);
  }
  if (iVar2 < 1) {
    __assert_fail("hCutBest > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x28c,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
  }
  Mpm_ObjTranslateCutsFromStore(p,pObj);
  for (lVar12 = 0; (lVar12 != 3 && ((uint)pObj->pFans[lVar12] < 0xfffffffe)); lVar12 = lVar12 + 1) {
    pMVar6 = Mig_ObjFanin(pObj,(int)lVar12);
    if (pMVar6 == (Mig_Obj_t *)0x0) break;
    if ((uint)pMVar6->pFans[1] < 0xfffffffe) {
      iVar2 = Mig_ObjMigRefDec(p,pMVar6);
      if (iVar2 == 0) {
        Mpm_ObjRecycleCuts(p,pMVar6);
      }
    }
  }
  pMVar6 = Mig_ObjSibl(pObj);
  if (pMVar6 != (Mig_Obj_t *)0x0) {
    iVar2 = Mig_ObjMigRefDec(p,pMVar6);
    if (iVar2 == 0) {
      Mpm_ObjRecycleCuts(p,pMVar6);
    }
  }
  iVar2 = Vec_IntEntry(&p->vMigRefs,(uint)pObj->pFans[3] >> 1);
  if (iVar2 == 0) {
    Mpm_ObjRecycleCuts(p,pObj);
  }
  return 1;
}

Assistant:

int Mpm_ManDeriveCuts( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut0, * pCut1, * pCut2;
    int Required = Mpm_ObjRequired( p, pObj );
    int hCutBest = Mpm_ObjCutBest( p, pObj );
    int c0, c1, c2;
#ifdef MIG_RUNTIME
abctime clk;
#endif

    assert( Vec_PtrSize( &p->vFreeUnits ) == p->nNumCuts + 1 );
    assert( Mpm_ObjCutList(p, pObj) == 0 );
    p->nCutStore = 0;
    if ( hCutBest > 0 ) // cut list is assigned
    {
        Mpm_Cut_t * pCut = Mpm_ObjCutBestP( p, pObj ); 
        int Times = Mpm_CutGetArrTime( p, pCut );
        assert( pCut->hNext == 0 );
        if ( Times > Required )
            printf( "Arrival time (%d) exceeds required time (%d) at object %d.\n", Times, Required, Mig_ObjId(pObj) );
        if ( p->fMainRun )
            Mpm_ObjAddCutToStore( p, Mpm_ManMergeCuts(p, pCut, NULL, NULL), Times );
        else
            Mpm_ObjSetTime( p, pObj, Times );
    }
    // start storage with choice cuts
    if ( Mig_ManChoiceNum(p->pMig) && Mig_ObjSiblId(pObj) )
        Mpm_ObjAddChoiceCutsToStore( p, pObj, Mig_ObjSibl(pObj), Required );

#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
    Mpm_ObjPrepareFanins( p, pObj );
    if ( Mig_ObjIsNode2(pObj) )
    {
        // go through cut pairs
        for ( c0 = 0; c0 < p->nCuts[0] && (pCut0 = p->pCuts[0][c0]); c0++ )
        for ( c1 = 0; c1 < p->nCuts[1] && (pCut1 = p->pCuts[1][c1]); c1++ )
            if ( Abc_TtCountOnes(p->pSigns[0][c0] | p->pSigns[1][c1]) <= p->nLutSize )
                if ( !Mpm_ManExploreNewCut( p, pObj, pCut0, pCut1, NULL, Required ) )
                    goto finish;
    }
    else if ( Mig_ObjIsNode3(pObj) )
    {
        // go through cut triples
        for ( c0 = 0; c0 < p->nCuts[0] && (pCut0 = p->pCuts[0][c0]); c0++ )
        for ( c1 = 0; c1 < p->nCuts[1] && (pCut1 = p->pCuts[1][c1]); c1++ )
        for ( c2 = 0; c2 < p->nCuts[2] && (pCut2 = p->pCuts[2][c2]); c2++ )
            if ( Abc_TtCountOnes(p->pSigns[0][c0] | p->pSigns[1][c1] | p->pSigns[2][c2]) <= p->nLutSize )
                if ( !Mpm_ManExploreNewCut( p, pObj, pCut0, pCut1, pCut2, Required ) )
                    goto finish;
    }
    else assert( 0 );
#ifdef MIG_RUNTIME
p->timeDerive += Abc_Clock() - clk;
#endif

finish:
    // save best cut
    assert( p->nCutStore > 0 );
    if ( p->pCutStore[0]->mTime <= Required )
    {
        Mpm_Cut_t * pCut;
        if ( hCutBest )
            Mmr_StepRecycle( p->pManCuts, hCutBest );
        hCutBest = Mpm_CutCreate( p, &p->pCutStore[0]->pCut, &pCut );
        Mpm_ObjSetCutBest( p, pObj, hCutBest );
        Mpm_ObjSetTime( p, pObj, p->pCutStore[0]->mTime );
        Mpm_ObjSetArea( p, pObj, p->pCutStore[0]->mArea );
        Mpm_ObjSetEdge( p, pObj, p->pCutStore[0]->mEdge );
    }
    else assert( !p->fMainRun );
    assert( hCutBest > 0 );
    // transform internal storage into regular cuts
    Mpm_ObjTranslateCutsFromStore( p, pObj );
    // dereference fanin cuts and reference node
    Mpm_ObjDerefFaninCuts( p, pObj );
    return 1;
}